

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

string * perfetto::base::ReplaceAll
                   (string *__return_storage_ptr__,string *str,string *to_replace,
                   string *replacement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *__s;
  size_t sVar5;
  string sStack_80;
  string sStack_60;
  
  if (to_replace->_M_string_length != 0) {
    for (uVar4 = ::std::__cxx11::string::find((char *)str,(ulong)(to_replace->_M_dataplus)._M_p,0);
        uVar4 != 0xffffffffffffffff;
        uVar4 = ::std::__cxx11::string::find
                          ((char *)str,(ulong)(to_replace->_M_dataplus)._M_p,
                           uVar4 + replacement->_M_string_length)) {
      ::std::__cxx11::string::replace
                ((ulong)str,uVar4,(char *)to_replace->_M_string_length,
                 (ulong)(replacement->_M_dataplus)._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    paVar1 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = str->_M_string_length;
    (str->_M_dataplus)._M_p = (pointer)paVar1;
    str->_M_string_length = 0;
    (str->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  ReplaceAll();
  __s = getenv("TMPDIR");
  if (__s == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/tmp","");
  }
  else {
    sStack_60._M_dataplus._M_p = (pointer)&sStack_60.field_2;
    sVar5 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_60,__s,__s + sVar5);
    sStack_80._M_dataplus._M_p = (pointer)&sStack_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_80,"/","");
    StripSuffix(__return_storage_ptr__,&sStack_60,&sStack_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
      operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_60._M_dataplus._M_p != &sStack_60.field_2) {
      operator_delete(sStack_60._M_dataplus._M_p,sStack_60.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceAll(std::string str,
                       const std::string& to_replace,
                       const std::string& replacement) {
  PERFETTO_CHECK(!to_replace.empty());
  size_t pos = 0;
  while ((pos = str.find(to_replace, pos)) != std::string::npos) {
    str.replace(pos, to_replace.length(), replacement);
    pos += replacement.length();
  }
  return str;
}